

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O3

void do_com_sub_exp(dill_stream c,basic_block_conflict bb,virtual_insn *insns,int loc)

{
  short *psVar1;
  virtual_insn *insn;
  int *piVar2;
  anon_struct_4_2_0bc3ac41_for_use_info *paVar3;
  char cVar4;
  char cVar5;
  special_operations sVar6;
  vreg_info *pvVar7;
  bool bVar8;
  char cVar9;
  uint vreg;
  special_operations vreg_00;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  byte bVar14;
  ulong uVar15;
  int iVar16;
  virtual_insn *pvVar17;
  void *info_ptr;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  int used_vregs [3];
  uint local_3c;
  uint local_38;
  uint local_34;
  void *pvVar13;
  
  insn = insns + loc;
  vreg = insn_defines(insn);
  if ((vreg != 0xffffffff) && (insn_uses(insn,(int *)&local_3c), local_3c != 0xffffffff)) {
    cVar9 = insn->class_code;
    bVar20 = false;
    if (cVar9 == '\0') {
      bVar20 = insn->insn_code == '(';
    }
    if (local_34 != vreg && (local_38 != vreg && local_3c != vreg)) {
      if (c->dill_debug != 0) {
        pvVar13 = (void *)(ulong)(uint)loc;
        printf("Try to replace %d ");
        virtual_print_insn(c,pvVar13,insn);
        putchar(10);
        cVar9 = insn->class_code;
      }
      if ((byte)(cVar9 - 5U) < 2) {
        bVar21 = (insn->insn_code & 0x10U) == 0;
      }
      else {
        bVar21 = false;
      }
      uVar15 = (ulong)(loc + 1);
      if ((long)uVar15 <= bb->end) {
        iVar16 = loc + 2;
        uVar18 = uVar15;
        do {
          pvVar17 = insns + uVar18;
          vreg_00 = insn_defines(pvVar17);
          pvVar13 = (void *)CONCAT44(extraout_var,vreg_00);
          iVar10 = insn_define_test(pvVar17,vreg);
          iVar11 = insn_define_test(pvVar17,local_3c);
          iVar11 = iVar11 + iVar10;
          if (local_38 != 0xffffffff) {
            iVar10 = insn_define_test(pvVar17,local_38);
            iVar11 = iVar11 + iVar10;
          }
          if (local_34 != 0xffffffff) {
            iVar10 = insn_define_test(pvVar17,local_34);
            iVar11 = iVar11 + iVar10;
          }
          bVar14 = 0;
          if (((((byte)(pvVar17->class_code - 5U) < 2) &&
               (bVar14 = (pvVar17->insn_code & 0x10U) >> 4 & bVar21, bVar20)) &&
              (pvVar17->class_code == '\x06')) &&
             (((pvVar17->opnds).a3.src1 == vreg && ((pvVar17->opnds).bri.imm_a == (void *)0x0)))) {
            bVar8 = true;
            if (c->p->vregs[(long)(int)vreg + -100].use_info.use_count == 1) {
              if (c->dill_debug != 0) {
                info_ptr = pvVar13;
                printf("load opt, changing  - ");
                virtual_print_insn(c,info_ptr,pvVar17);
                printf(" - to - ");
              }
              pvVar17->class_code = '\x05';
              (pvVar17->opnds).a3.src1 = local_3c;
              (pvVar17->opnds).a3.src2 = local_38;
              if (c->dill_debug != 0) {
                virtual_print_insn(c,pvVar13,pvVar17);
                putchar(10);
              }
              pvVar7 = c->p->vregs;
              if (99 < (int)vreg) {
                pvVar7[(ulong)vreg - 100].use_info.use_count =
                     pvVar7[(ulong)vreg - 100].use_info.use_count + -1;
              }
              if (pvVar7[(long)(int)vreg + -100].use_info.use_count != 0) goto LAB_00112191;
              psVar1 = &pvVar7[(long)(int)vreg + -100].use_info.def_count;
              *psVar1 = *psVar1 + -1;
              if (c->dill_debug != 0) {
                printf("load opt eliminating  - ");
                virtual_print_insn(c,pvVar13,insn);
                putchar(10);
              }
              insn->class_code = '\x18';
            }
          }
          else {
LAB_00112191:
            if (vreg_00 != ~DILL_NOP) {
              iVar10 = insn_use_test(pvVar17,vreg);
              if (iVar10 != 0) {
                bVar20 = false;
              }
              cVar9 = pvVar17->class_code;
              bVar8 = bVar20;
              if (cVar9 != insn->class_code) goto LAB_00112389;
              cVar4 = pvVar17->insn_code;
              cVar5 = insn->insn_code;
              switch(cVar9) {
              case '\0':
              case '\x05':
switchD_001121e1_caseD_0:
                if ((cVar4 == cVar5) && ((pvVar17->opnds).a3.src1 == (insn->opnds).a3.src1)) {
                  bVar22 = (pvVar17->opnds).a3.src2 == (insn->opnds).a3.src2;
LAB_00112353:
                  if (((bool)(99 < (int)vreg_00 & bVar22)) &&
                     (((byte)bb->live_at_end->vec[vreg_00 - 100 >> 3] >> (vreg_00 - 100 & 7) & 1) ==
                      0)) {
                    if (c->dill_debug != 0) {
                      pvVar13 = (void *)(uVar18 & 0xffffffff);
                      printf("eliminating  - - %d - ");
                      virtual_print_insn(c,pvVar13,pvVar17);
                      putchar(10);
                      cVar9 = pvVar17->class_code;
                    }
                    if ((((long)uVar15 < (long)uVar18 && cVar9 == '\x05') &&
                        (pvVar17[-1].class_code == '\x0e')) && (pvVar17[-1].opnds.a3.dest == 1)) {
                      pvVar17[-1].class_code = '\x18';
                    }
                    pvVar17->class_code = '\x18';
                    if ((long)uVar18 < bb->end) {
                      uVar19 = (ulong)iVar16;
                      pvVar17 = insns + uVar19;
                      do {
                        iVar10 = insn_define_test(pvVar17,vreg_00);
                        pvVar13 = (void *)(ulong)vreg_00;
                        iVar12 = insn_use_test(pvVar17,vreg_00);
                        if (iVar12 == 0) goto LAB_00112598;
                        if (c->dill_debug != 0) {
                          pvVar13 = (void *)(ulong)vreg;
                          printf("   Reg %d forward subst - Replacing %d ",pvVar13,
                                 uVar19 & 0xffffffff);
                          virtual_print_insn(c,pvVar13,pvVar17);
                          printf(" with ");
                        }
                        switch(pvVar17->class_code) {
                        case '\0':
                        case '\x16':
                          if ((pvVar17->opnds).a3.src1 != vreg_00) {
                            if ((pvVar17->opnds).a3.src2 != vreg_00) goto switchD_001124c9_caseD_7;
                            goto LAB_00112504;
                          }
                          goto LAB_001124d4;
                        case '\x03':
                        case '\f':
                        case '\x0f':
                          goto switchD_001124c9_caseD_3;
                        case '\x05':
                          if ((pvVar17->opnds).a3.src1 == vreg_00) goto LAB_001124d4;
                          if ((pvVar17->opnds).a3.src2 != vreg_00) goto LAB_00112524;
LAB_00112504:
                          (pvVar17->opnds).a3.src2 = vreg;
                          break;
                        case '\x06':
                          if ((pvVar17->opnds).a3.src1 == vreg_00) goto LAB_001124d4;
LAB_00112524:
                          if ((pvVar17->insn_code & 0x10U) == 0) goto switchD_001124c9_caseD_7;
switchD_001124c9_caseD_3:
                          if ((pvVar17->opnds).a3.dest != vreg_00) goto switchD_001124c9_caseD_7;
LAB_00112537:
                          (pvVar17->opnds).a3.dest = vreg;
                          break;
                        default:
                          goto switchD_001124c9_caseD_7;
                        case '\v':
                          if ((pvVar17->opnds).a3.dest == vreg_00) goto LAB_00112537;
                        case '\x01':
                        case '\x02':
                        case '\x04':
                        case '\t':
                        case '\x15':
                          if ((pvVar17->opnds).a3.src1 != vreg_00) {
switchD_001124c9_caseD_7:
                            __assert_fail("0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/dill/dill/virtual.c"
                                          ,0x3b7,"void replace_insn_src(virtual_insn *, int, int)");
                          }
LAB_001124d4:
                          (pvVar17->opnds).a3.src1 = vreg;
                          break;
                        case '\x11':
                          sVar6 = (pvVar17->opnds).spec.type;
                          if ((sVar6 != vreg_00) || ((sVar6 & 0x8000) != DILL_NOP))
                          goto switchD_001124c9_caseD_7;
                          goto LAB_00112537;
                        }
                        if ((int)vreg < 100) {
                          piVar2 = &c->p->c_param_args[(int)vreg].used;
                          *piVar2 = *piVar2 + 1;
                        }
                        else {
                          paVar3 = &c->p->vregs[(ulong)vreg - 100].use_info;
                          paVar3->use_count = paVar3->use_count + 1;
                        }
                        if (c->dill_debug != 0) {
                          virtual_print_insn(c,pvVar13,pvVar17);
                          putchar(10);
                        }
LAB_00112598:
                        if (bb->end <= (long)uVar19) break;
                        uVar19 = uVar19 + 1;
                        pvVar17 = pvVar17 + 1;
                      } while (iVar10 == 0);
                    }
                    goto LAB_00112389;
                  }
                }
                break;
              case '\x01':
              case '\x06':
                if ((cVar4 == cVar5) && ((pvVar17->opnds).a3.src1 == (insn->opnds).a3.src1)) {
LAB_0011234b:
                  bVar22 = (pvVar17->opnds).bri.imm_a == (insn->opnds).bri.imm_a;
                  goto LAB_00112353;
                }
                break;
              case '\x02':
              case '\x04':
              case '\t':
                if (cVar4 == cVar5) {
                  bVar22 = (pvVar17->opnds).a3.src1 == (insn->opnds).a3.src1;
                  goto LAB_00112353;
                }
                break;
              case '\x03':
              case '\a':
              case '\b':
                break;
              default:
                if (cVar9 == '\x15') {
                  if ((pvVar17->opnds).a3.src1 == (insn->opnds).a3.src1) goto LAB_0011234b;
                }
                else if (cVar9 == '\x16') goto switchD_001121e1_caseD_0;
              }
            }
            bVar8 = bVar20;
          }
LAB_00112389:
          bVar20 = bVar8;
          if (bb->end <= (long)uVar18) break;
          uVar18 = uVar18 + 1;
          iVar16 = iVar16 + 1;
        } while (iVar11 == 0 && bVar14 == 0);
      }
      if (c->dill_debug != 0) {
        puts("stopped ");
        return;
      }
    }
  }
  return;
}

Assistant:

static void
do_com_sub_exp(dill_stream c, basic_block bb, virtual_insn* insns, int loc)
{
    virtual_insn* root_insn = &((virtual_insn*)insns)[loc];
    int def_vreg = insn_defines(root_insn);
    int do_ldi0_optim = 0;
    int k;
    int stop = 0;
    int used_vregs[3];
    int root_is_load;
    if (def_vreg == -1)
        return;
    insn_uses(root_insn, &used_vregs[0]);
    if (used_vregs[0] == -1)
        return;
    if ((root_insn->class_code == iclass_arith3) &&
        (root_insn->insn_code == dill_jmp_addp))
        do_ldi0_optim = 1;

    if (def_vreg != -1) {
        if ((used_vregs[0] == def_vreg) || (used_vregs[1] == def_vreg) ||
            (used_vregs[2] == def_vreg))
            return;
    }

    /*
     * see if we can find an instruction just like (
     * except for dest) this ahead
     */
    if (c->dill_debug) {
        printf("Try to replace %d ", loc);
        virtual_print_insn(c, NULL, root_insn);
        printf("\n");
    }
    root_is_load = (((root_insn->class_code == iclass_loadstorei) ||
                     (root_insn->class_code == iclass_loadstore)) &&
                    (((root_insn->insn_code & 0x10) == 0x10) == 0));
    for (k = loc + 1; ((k <= bb->end) && (!stop)); k++) {
        virtual_insn* ip = &((virtual_insn*)insns)[k];
        int replace_vreg = insn_defines(ip);
        int l, stop2, insn_is_store;
        /* stop looking if old dest is wiped */
        if (insn_define_test(ip, def_vreg))
            stop++;
        /* stop looking if srcs become different */
        if (insn_define_test(ip, used_vregs[0]))
            stop++;
        if ((used_vregs[1] != -1) && insn_define_test(ip, used_vregs[1]))
            stop++;
        if ((used_vregs[2] != -1) && insn_define_test(ip, used_vregs[2]))
            stop++;
        /* stop looking if this is a load and we're about to pass a store */
        insn_is_store = (((ip->class_code == iclass_loadstorei) ||
                          (ip->class_code == iclass_loadstore)) &&
                         ((ip->insn_code & 0x10) == 0x10));
        if (root_is_load && insn_is_store)
            stop++;

        if (do_ldi0_optim && (ip->class_code == iclass_loadstorei) &&
            (ip->opnds.a3i.src == def_vreg) && (ip->opnds.a3i.u.imm == 0)) {
            int use_target = 1;
            /*
             * we've found a load immediate with an imm of 0 and with
             * a source that is the result of a prior add
             * combine them.
             */
            if (def_vreg == used_vregs[0])
                use_target++;
            if (def_vreg == used_vregs[1])
                use_target++;
            if ((use_target != 0) &&
                (c->p->vregs[def_vreg - 100].use_info.use_count !=
                 use_target)) {
                continue;
            }
            if (c->dill_debug) {
                printf("load opt, changing  - ");
                virtual_print_insn(c, NULL, ip);
                printf(" - to - ");
            }
            ip->class_code = iclass_loadstore;
            ip->opnds.a3.dest = ip->opnds.a3i.dest;
            ip->opnds.a3.src1 = used_vregs[0];
            ip->opnds.a3.src2 = used_vregs[1];
            if (c->dill_debug) {
                virtual_print_insn(c, NULL, ip);
                printf("\n");
            }
            if (def_vreg >= 100) {
                c->p->vregs[def_vreg - 100].use_info.use_count--;
            }
            if (c->p->vregs[def_vreg - 100].use_info.use_count ==
                (use_target - 1)) {
                c->p->vregs[def_vreg - 100].use_info.def_count--;
                if (c->dill_debug) {
                    printf("load opt eliminating  - ");
                    virtual_print_insn(c, NULL, root_insn);
                    printf("\n");
                }
                root_insn->class_code = iclass_nop;
                continue;
            }
        }

        if (replace_vreg == -1)
            continue;
        if (insn_use_test(ip, def_vreg))
            do_ldi0_optim = 0;

        /*
         * insn is the same except for dest, make it a noop
         * and fixup uses of replace_vreg going forward
         */
        if (!insn_same_except_dest(ip, root_insn))
            continue;
        if (live_at_end(bb, replace_vreg))
            continue;
        if (c->dill_debug) {
            printf("eliminating  - - %d - ", k);
            virtual_print_insn(c, NULL, ip);
            printf("\n");
        }

        if (ip->class_code == iclass_loadstore) {
            if (k > loc + 1) {
                virtual_insn* previous_ip = &((virtual_insn*)insns)[k - 1];
                if ((previous_ip->class_code == iclass_special) &&
                    (previous_ip->opnds.spec.type == DILL_SEGMENTED_FOLLOWS)) {
                    /*
                     * We're eliminating a loadstore and previous was a
                     * special SEGMENTED_FOLLOWS, kill the special too.
                     */
                    previous_ip->class_code = iclass_nop;
                }
            }
        }

        ip->class_code = iclass_nop;
        stop2 = 0;
        for (l = k + 1; ((l <= bb->end) && (!stop2)); l++) {
            virtual_insn* sub_ip = &((virtual_insn*)insns)[l];
            if (insn_define_test(sub_ip, replace_vreg)) {
                stop2++;
            }
            if (!insn_use_test(sub_ip, replace_vreg))
                continue;
            if (c->dill_debug) {
                printf("   Reg %d forward subst - Replacing %d ", def_vreg, l);
                virtual_print_insn(c, NULL, sub_ip);
                printf(" with ");
            }
            replace_insn_src(sub_ip, replace_vreg, def_vreg);
            set_used(c, def_vreg);
            if (c->dill_debug) {
                virtual_print_insn(c, NULL, sub_ip);
                printf("\n");
            }
        }
    }
    if (c->dill_debug) {
        printf("stopped \n");
    }
}